

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O2

QArrayDataPointer<QWindowSystemInterface::TouchPoint> * __thiscall
QArrayDataPointer<QWindowSystemInterface::TouchPoint>::operator=
          (QArrayDataPointer<QWindowSystemInterface::TouchPoint> *this,
          QArrayDataPointer<QWindowSystemInterface::TouchPoint> *other)

{
  TouchPoint *pTVar1;
  qsizetype qVar2;
  long in_FS_OFFSET;
  Data *pDVar3;
  QArrayDataPointer<QWindowSystemInterface::TouchPoint> local_28;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = other->d;
  pTVar1 = other->ptr;
  qVar2 = other->size;
  if (pDVar3 == (Data *)0x0) {
    pDVar3 = (Data *)0x0;
  }
  else {
    LOCK();
    (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_28.d = this->d;
  local_28.ptr = this->ptr;
  this->d = pDVar3;
  this->ptr = pTVar1;
  local_28.size = this->size;
  this->size = qVar2;
  ~QArrayDataPointer(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
    __stack_chk_fail();
  }
  return this;
}

Assistant:

QArrayDataPointer &operator=(const QArrayDataPointer &other) noexcept
    {
        QArrayDataPointer tmp(other);
        this->swap(tmp);
        return *this;
    }